

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int nn_base64_encode(uint8_t *in,size_t in_len,char *out,size_t out_len)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  if (in_len == 0) {
    uVar4 = 0;
    uVar3 = 0;
    uVar6 = 0;
  }
  else {
    uVar2 = 0;
    uVar6 = 0;
    uVar3 = 0;
    uVar4 = 0;
    do {
      uVar6 = uVar6 << 8 | (uint)in[uVar2];
      uVar3 = uVar3 + 8;
      uVar5 = uVar4;
      do {
        if (out_len <= uVar5) {
          return -0x69;
        }
        uVar3 = uVar3 - 6;
        uVar4 = (ulong)((int)uVar5 + 1);
        out[uVar5] = (&DAT_001b9280)[uVar6 >> ((byte)uVar3 & 0x1f) & 0x3f];
        uVar5 = uVar4;
      } while (5 < uVar3);
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (uVar2 < in_len);
  }
  if (uVar3 != 0) {
    if (out_len <= uVar4) {
      return -0x69;
    }
    out[uVar4] = (&DAT_001b9280)[uVar6 << (6U - (char)uVar3 & 0x1f) & 0x3f];
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  while( true ) {
    if ((uVar4 & 3) == 0) {
      iVar1 = -0x69;
      if (uVar4 < out_len) {
        out[uVar4] = '\0';
        iVar1 = (int)uVar4;
      }
      return iVar1;
    }
    if (out_len <= uVar4) break;
    out[uVar4] = '=';
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  return -0x69;
}

Assistant:

int nn_base64_encode (const uint8_t *in, size_t in_len,
    char *out, size_t out_len)
{
    unsigned ii;
    unsigned io;
    unsigned rem;
    uint32_t v;
    uint8_t ch;

    const uint8_t ENCODEMAP [64] =
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "abcdefghijklmnopqrstuvwxyz"
        "0123456789+/";

    for (io = 0, ii = 0, v = 0, rem = 0; ii < in_len; ii++) {
        ch = in [ii];
        v = (v << 8) | ch;
        rem += 8;
        while (rem >= 6) {
            rem -= 6;
            if (io >= out_len)
                return -ENOBUFS;
            out [io++] = ENCODEMAP [(v >> rem) & 63];
        }
    }

    if (rem) {
        v <<= (6 - rem);
        if (io >= out_len)
            return -ENOBUFS;
        out [io++] = ENCODEMAP [v & 63];
    }

    /*  Pad to a multiple of 3. */
    while (io & 3) {
        if (io >= out_len)
            return -ENOBUFS;
        out [io++] = '=';
    }

    if (io >= out_len)
        return -ENOBUFS;
    
    out [io] = '\0';

    return io;
}